

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_ep_fini(void *arg)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  nni_aio_fini((nni_aio *)((long)arg + 0x58));
  nni_aio_fini((nni_aio *)((long)arg + 0x220));
  nni_aio_fini((nni_aio *)((long)arg + 0x490));
  nni_aio_fini((nni_aio *)((long)arg + 0x658));
  if (*arg != (nni_plat_udp *)0x0) {
    nni_plat_udp_close(*arg);
  }
  if (*(short *)((long)arg + 0xa46) != 0) {
    lVar1 = *(long *)((long)arg + 0xa38);
    lVar2 = 0x18;
    uVar3 = 0;
    do {
      nni_msg_free(*(nni_msg **)(lVar1 + lVar2));
      lVar1 = *(long *)((long)arg + 0xa38);
      *(undefined8 *)(lVar1 + lVar2) = 0;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0xb0;
    } while (uVar3 < *(ushort *)((long)arg + 0xa46));
  }
  nni_msg_free(*(nni_msg **)((long)arg + 0x400));
  nni_id_map_fini((nni_id_map *)((long)arg + 0x820));
  nni_free(*(void **)((long)arg + 0xa38),(ulong)*(ushort *)((long)arg + 0xa46) * 0xb0);
  return;
}

Assistant:

static void
udp_ep_fini(void *arg)
{
	udp_ep *ep = arg;

	nni_aio_fini(&ep->timeaio);
	nni_aio_fini(&ep->resaio);
	nni_aio_fini(&ep->tx_aio);
	nni_aio_fini(&ep->rx_aio);

	if (ep->udp != NULL) {
		nni_udp_close(ep->udp);
	}

	for (int i = 0; i < ep->tx_ring.size; i++) {
		nni_msg_free(ep->tx_ring.descs[i].payload);
		ep->tx_ring.descs[i].payload = NULL;
	}
	nni_msg_free(ep->rx_payload); // safe even if msg is null
	nni_id_map_fini(&ep->pipes);
	NNI_FREE_STRUCTS(ep->tx_ring.descs, ep->tx_ring.size);
}